

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void icu_63::DecimalFormat::fieldPositionHelper
               (FormattedNumber *formatted,FieldPosition *fieldPosition,int32_t offset,
               UErrorCode *status)

{
  UBool UVar1;
  FieldPositionOnlyHandler fpoh;
  FieldPositionOnlyHandler local_30;
  
  fieldPosition->fBeginIndex = 0;
  fieldPosition->fEndIndex = 0;
  UVar1 = icu_63::number::FormattedNumber::nextFieldPosition(formatted,fieldPosition,status);
  if ((offset != 0) && (UVar1 != '\0')) {
    FieldPositionOnlyHandler::FieldPositionOnlyHandler(&local_30,fieldPosition);
    FieldPositionOnlyHandler::shiftLast(&local_30,offset);
    FieldPositionOnlyHandler::~FieldPositionOnlyHandler(&local_30);
  }
  return;
}

Assistant:

void
DecimalFormat::fieldPositionHelper(const number::FormattedNumber& formatted, FieldPosition& fieldPosition,
                                   int32_t offset, UErrorCode& status) {
    // always return first occurrence:
    fieldPosition.setBeginIndex(0);
    fieldPosition.setEndIndex(0);
    bool found = formatted.nextFieldPosition(fieldPosition, status);
    if (found && offset != 0) {
        FieldPositionOnlyHandler fpoh(fieldPosition);
        fpoh.shiftLast(offset);
    }
}